

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ParseFunctionBodyInfo
               (FunctionBodyResolveInfo *fbInfo,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  uint uVar1;
  TTD_PTR_ID TVar2;
  TTD_LOG_PTR_ID TVar3;
  TTD_WELLKNOWN_TOKEN pcVar4;
  int64 iVar5;
  bool isWellKnown;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  FunctionBodyResolveInfo *fbInfo_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01);
  TVar2 = FileReader::ReadAddr(reader,functionBodyId,false);
  fbInfo->FunctionBodyId = TVar2;
  TVar3 = FileReader::ReadLogTag(reader,ctxTag,true);
  fbInfo->ScriptContextLogId = TVar3;
  FileReader::ReadString<TTD::SlabAllocatorBase<0>>(reader,name,alloc,&fbInfo->FunctionName,true);
  uVar1 = (*reader->_vptr_FileReader[10])(reader,0x19,1);
  if ((uVar1 & 1) == 0) {
    fbInfo->OptKnownPath = (TTD_WELLKNOWN_TOKEN)0x0;
    TVar2 = FileReader::ReadAddr(reader,parentBodyId,true);
    fbInfo->OptParentBodyId = TVar2;
    iVar5 = FileReader::ReadInt64(reader,line,true);
    fbInfo->OptLine = iVar5;
    iVar5 = FileReader::ReadInt64(reader,column,true);
    fbInfo->OptColumn = iVar5;
  }
  else {
    pcVar4 = FileReader::ReadWellKnownToken<TTD::SlabAllocatorBase<0>>
                       (reader,wellKnownToken,alloc,true);
    fbInfo->OptKnownPath = pcVar4;
    fbInfo->OptParentBodyId = 0;
    fbInfo->OptLine = -1;
    fbInfo->OptColumn = -1;
  }
  (*reader->_vptr_FileReader[3])(reader,0x43,1);
  ParseSnapFunctionBodyScopeChain(&fbInfo->ScopeChainInfo,reader,alloc);
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseFunctionBodyInfo(FunctionBodyResolveInfo* fbInfo, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            fbInfo->FunctionBodyId = reader->ReadAddr(NSTokens::Key::functionBodyId);
            fbInfo->ScriptContextLogId = reader->ReadLogTag(NSTokens::Key::ctxTag, true);
            reader->ReadString(NSTokens::Key::name, alloc, fbInfo->FunctionName, true);

            bool isWellKnown = reader->ReadBool(NSTokens::Key::isWellKnownToken, true);
            if(isWellKnown)
            {
                fbInfo->OptKnownPath = reader->ReadWellKnownToken(NSTokens::Key::wellKnownToken, alloc, true);

                fbInfo->OptParentBodyId = TTD_INVALID_PTR_ID;
                fbInfo->OptLine = -1;
                fbInfo->OptColumn = -1;
            }
            else
            {
                fbInfo->OptKnownPath = TTD_INVALID_WELLKNOWN_TOKEN;

                fbInfo->OptParentBodyId = reader->ReadAddr(NSTokens::Key::parentBodyId, true);
                fbInfo->OptLine = reader->ReadInt64(NSTokens::Key::line, true);
                fbInfo->OptColumn = reader->ReadInt64(NSTokens::Key::column, true);
            }

            reader->ReadKey(NSTokens::Key::scopeChain, true);
            ParseSnapFunctionBodyScopeChain(fbInfo->ScopeChainInfo, reader, alloc);

            reader->ReadRecordEnd();
        }